

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructPreDecl
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    local_28 = code_ptr;
    code = code_ptr;
    code_ptr_local = (string *)struct_def;
    struct_def_local = (StructDef *)this;
    CheckNameSpace(this,&struct_def->super_Definition,code_ptr);
    NormalizedName_abi_cxx11_(&local_88,this,(Definition *)code_ptr_local);
    std::operator+(&local_68,"class ",&local_88);
    std::operator+(&local_48,&local_68,"\n\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void GenStructPreDecl(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(struct_def, &code);
    code += "class " + NormalizedName(struct_def) + "\n\n";
  }